

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

vector<crnlib::vector<unsigned_int>_> * __thiscall
crnlib::vector<crnlib::vector<unsigned_int>_>::operator=
          (vector<crnlib::vector<unsigned_int>_> *this,vector<crnlib::vector<unsigned_int>_> *other)

{
  undefined8 *puVar1;
  void *pvVar2;
  vector<unsigned_int> *pvVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  vector<unsigned_int> *pvVar7;
  
  if (this != other) {
    uVar5 = other->m_size;
    if (this->m_capacity < uVar5) {
      pvVar7 = this->m_p;
      if (pvVar7 != (vector<unsigned_int> *)0x0) {
        uVar5 = this->m_size;
        if ((ulong)uVar5 != 0) {
          lVar6 = 0;
          do {
            pvVar2 = *(void **)((long)&pvVar7->m_p + lVar6);
            if (pvVar2 != (void *)0x0) {
              crnlib_free(pvVar2);
            }
            lVar6 = lVar6 + 0x10;
          } while ((ulong)uVar5 << 4 != lVar6);
          pvVar7 = this->m_p;
        }
        crnlib_free(pvVar7);
        this->m_p = (vector<unsigned_int> *)0x0;
        this->m_size = 0;
        this->m_capacity = 0;
        uVar5 = other->m_size;
      }
      elemental_vector::increase_capacity
                ((elemental_vector *)this,uVar5,false,0x10,(object_mover)0x0,false);
    }
    else {
      uVar5 = this->m_size;
      if ((ulong)uVar5 != 0) {
        pvVar7 = this->m_p;
        lVar6 = 0;
        do {
          pvVar2 = *(void **)((long)&pvVar7->m_p + lVar6);
          if (pvVar2 != (void *)0x0) {
            crnlib_free(pvVar2);
          }
          lVar6 = lVar6 + 0x10;
        } while ((ulong)uVar5 << 4 != lVar6);
        this->m_size = 0;
      }
    }
    uVar4 = other->m_size;
    if (uVar4 == 0) {
      uVar4 = 0;
    }
    else {
      pvVar7 = other->m_p;
      pvVar3 = this->m_p;
      lVar6 = 0;
      do {
        puVar1 = (undefined8 *)((long)&pvVar3->m_p + lVar6);
        *puVar1 = 0;
        puVar1[1] = 0;
        elemental_vector::increase_capacity
                  ((elemental_vector *)((long)&pvVar3->m_p + lVar6),
                   *(uint *)((long)&pvVar7->m_size + lVar6),false,4,(object_mover)0x0,false);
        uVar5 = *(uint *)((long)&pvVar7->m_size + lVar6);
        *(uint *)((long)&pvVar3->m_size + lVar6) = uVar5;
        memcpy(*(void **)((long)&pvVar3->m_p + lVar6),*(void **)((long)&pvVar7->m_p + lVar6),
               (ulong)uVar5 << 2);
        lVar6 = lVar6 + 0x10;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
      uVar4 = other->m_size;
    }
    this->m_size = uVar4;
  }
  return this;
}

Assistant:

inline vector& operator=(const vector& other)
        {
            if (this == &other)
            {
                return *this;
            }

            if (m_capacity >= other.m_size)
            {
                resize(0);
            }
            else
            {
                clear();
                increase_capacity(other.m_size, false);
            }

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
            }
            else
            {
                T* pDst = m_p;
                const T* pSrc = other.m_p;
                for (uint i = other.m_size; i > 0; i--)
                {
                    helpers::construct(pDst++, *pSrc++);
                }
            }

            m_size = other.m_size;

            return *this;
        }